

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O0

sljit_label * sljit_emit_label(sljit_compiler *compiler)

{
  undefined1 *puVar1;
  sljit_label *label;
  sljit_u8 *inst;
  sljit_compiler *compiler_local;
  
  if (compiler->error == 0) {
    if ((compiler->last_label == (sljit_label *)0x0) ||
       (compiler->last_label->size != compiler->size)) {
      compiler_local = (sljit_compiler *)ensure_abuf(compiler,0x18);
      if (compiler_local == (sljit_compiler *)0x0) {
        compiler_local = (sljit_compiler *)0x0;
      }
      else {
        set_label((sljit_label *)compiler_local,compiler);
        puVar1 = (undefined1 *)ensure_buf(compiler,2);
        if (puVar1 == (undefined1 *)0x0) {
          compiler_local = (sljit_compiler *)0x0;
        }
        else {
          *puVar1 = 0;
          puVar1[1] = 0;
        }
      }
    }
    else {
      compiler_local = (sljit_compiler *)compiler->last_label;
    }
  }
  else {
    compiler_local = (sljit_compiler *)0x0;
  }
  return (sljit_label *)compiler_local;
}

Assistant:

sljit_label* sljit_emit_label(struct sljit_compiler *compiler)
{
	sljit_u8 *inst;
	struct sljit_label *label;

	CHECK_ERROR_PTR();
	CHECK_PTR(check_sljit_emit_label(compiler));

	if (compiler->last_label && compiler->last_label->size == compiler->size)
		return compiler->last_label;

	label = (struct sljit_label*)ensure_abuf(compiler, sizeof(struct sljit_label));
	PTR_FAIL_IF(!label);
	set_label(label, compiler);

	inst = (sljit_u8*)ensure_buf(compiler, 2);
	PTR_FAIL_IF(!inst);

	*inst++ = 0;
	*inst++ = 0;

	return label;
}